

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O0

bool wasm::Type::
     hasLeastUpperBound<std::unordered_set<wasm::Type,std::hash<wasm::Type>,std::equal_to<wasm::Type>,std::allocator<wasm::Type>>>
               (unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
                *types)

{
  bool bVar1;
  reference pvVar2;
  _Node_iterator_base<wasm::Type,_true> local_58;
  uintptr_t local_50;
  _Node_iterator_base<wasm::Type,_true> local_48;
  Type local_40;
  _Node_iterator_base<wasm::Type,_true> local_38;
  _Node_iterator_base<wasm::Type,_true> local_30;
  _Node_const_iterator<wasm::Type,_true,_true> second;
  const_iterator end;
  const_iterator first;
  unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
  *types_local;
  
  end = std::
        unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
        ::begin(types);
  second.super__Node_iterator_base<wasm::Type,_true>._M_cur =
       (_Node_iterator_base<wasm::Type,_true>)
       std::
       unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
       ::end(types);
  bVar1 = std::__detail::operator==
                    (&end.super__Node_iterator_base<wasm::Type,_true>,
                     &second.super__Node_iterator_base<wasm::Type,_true>);
  if (!bVar1) {
    local_38 = end.super__Node_iterator_base<wasm::Type,_true>._M_cur;
    local_30._M_cur =
         (__node_type *)
         std::next<std::__detail::_Node_const_iterator<wasm::Type,true,true>>
                   (end.super__Node_iterator_base<wasm::Type,_true>._M_cur,1);
    do {
      bVar1 = std::__detail::operator!=
                        (&local_30,&second.super__Node_iterator_base<wasm::Type,_true>);
      if (!bVar1) {
        return true;
      }
      local_48._M_cur =
           (__node_type *)
           std::__detail::_Node_const_iterator<wasm::Type,_true,_true>::operator++(&end,0);
      pvVar2 = std::__detail::_Node_const_iterator<wasm::Type,_true,_true>::operator*
                         ((_Node_const_iterator<wasm::Type,_true,_true> *)&local_48);
      local_40.id = pvVar2->id;
      local_58._M_cur =
           (__node_type *)
           std::__detail::_Node_const_iterator<wasm::Type,_true,_true>::operator++
                     ((_Node_const_iterator<wasm::Type,_true,_true> *)&local_30,0);
      pvVar2 = std::__detail::_Node_const_iterator<wasm::Type,_true,_true>::operator*
                         ((_Node_const_iterator<wasm::Type,_true,_true> *)&local_58);
      local_50 = pvVar2->id;
      bVar1 = hasLeastUpperBound(local_40,(Type)local_50);
    } while (((bVar1 ^ 0xffU) & 1) == 0);
  }
  return false;
}

Assistant:

static bool hasLeastUpperBound(const T& types) {
    auto first = types.begin(), end = types.end();
    if (first == end) {
      return false;
    }
    for (auto second = std::next(first); second != end;) {
      if (!hasLeastUpperBound(*first++, *second++)) {
        return false;
      }
    }
    return true;
  }